

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O0

HRESULT __thiscall
Js::SimpleDataCacheWrapper::SeekReadStreamToBlockHelper
          (SimpleDataCacheWrapper *this,BlockType blockType,ULONG *bytesInBlock)

{
  uint local_34;
  BlockType local_2d;
  ULONG byteCount;
  BlockType currentBlockType;
  ULONG *pUStack_28;
  HRESULT hr;
  ULONG *bytesInBlock_local;
  SimpleDataCacheWrapper *pSStack_18;
  BlockType blockType_local;
  SimpleDataCacheWrapper *this_local;
  
  local_2d = BlockType_Invalid;
  local_34 = 0;
  pUStack_28 = bytesInBlock;
  bytesInBlock_local._7_1_ = blockType;
  pSStack_18 = this;
  byteCount = Read<Js::SimpleDataCacheWrapper::BlockType>(this,&local_2d);
  this_local._4_4_ = byteCount;
  if ((-1 < (int)byteCount) &&
     (byteCount = Read<unsigned_int>(this,&local_34), this_local._4_4_ = byteCount,
     -1 < (int)byteCount)) {
    if (local_2d == bytesInBlock_local._7_1_) {
      if (pUStack_28 != (ULONG *)0x0) {
        *pUStack_28 = local_34;
      }
      this_local._4_4_ = 0;
    }
    else if ((local_2d == BlockType_Invalid) || (local_34 == 0)) {
      this_local._4_4_ = 0x80004005;
    }
    else {
      this_local._4_4_ = SeekReadStreamToBlockHelper(this,bytesInBlock_local._7_1_,pUStack_28);
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SeekReadStreamToBlockHelper(_In_ BlockType blockType, _Out_opt_ ULONG* bytesInBlock)
    {
        HRESULT hr;
        BlockType currentBlockType = BlockType_Invalid;
        ULONG byteCount = 0;

        IFFAILRET(Read(&currentBlockType));
        IFFAILRET(Read(&byteCount));

        if (currentBlockType == blockType)
        {
            if (bytesInBlock != nullptr)
            {
                *bytesInBlock = byteCount;
            }
            return S_OK;
        }
        else if (currentBlockType == BlockType_Invalid || byteCount == 0)
        {
            return E_FAIL;
        }

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        // The block we're pointing at is not the requested one, seek forward to the next block
        LARGE_INTEGER dlibMove;
        dlibMove.QuadPart = byteCount;
        IFFAILRET(this->inStream->Seek(dlibMove, STREAM_SEEK_CUR, nullptr));
#endif

        return SeekReadStreamToBlockHelper(blockType, bytesInBlock);
    }